

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::DecimalType::printTo(DecimalType *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  int *in_stack_00000118;
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"DecimalType(");
  poVar1 = std::operator<<(local_10,"scale=");
  duckdb_apache::thrift::to_string<int>(in_stack_00000118);
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"precision=");
  duckdb_apache::thrift::to_string<int>(in_stack_00000118);
  std::operator<<(poVar1,local_60);
  std::__cxx11::string::~string(local_60);
  std::operator<<(local_10,")");
  return;
}

Assistant:

void DecimalType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "DecimalType(";
  out << "scale=" << to_string(scale);
  out << ", " << "precision=" << to_string(precision);
  out << ")";
}